

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O2

bool __thiscall
OpenMD::Component::findMoleculeStamp
          (Component *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
          *molStamps)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  key_type kStack_38;
  
  std::__cxx11::string::string((string *)&kStack_38,(string *)&(this->Type).data_);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
          ::find(&molStamps->_M_t,&kStack_38);
  std::__cxx11::string::~string((string *)&kStack_38);
  p_Var2 = &(molStamps->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2) {
    this->moleculeStamp_ = *(MoleculeStamp **)(cVar1._M_node + 2);
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool Component::findMoleculeStamp(
      const std::map<std::string, MoleculeStamp*>& molStamps) {
    bool ret = false;
    std::map<std::string, MoleculeStamp*>::const_iterator i;
    i = molStamps.find(getType());
    if (i != molStamps.end()) {
      moleculeStamp_ = i->second;
      ret            = true;
    }
    return ret;
  }